

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O0

void luby_test(void)

{
  double dVar1;
  int local_c;
  int i;
  
  for (local_c = 0; local_c < 0x14; local_c = local_c + 1) {
    dVar1 = luby(2.0,local_c);
    printf("%d ",(ulong)(uint)(int)dVar1);
  }
  printf("\n");
  return;
}

Assistant:

void luby_test()
{
    int i;
    for ( i = 0; i < 20; i++ )
        printf( "%d ", (int)luby(2,i) );
    printf( "\n" );
}